

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::DummyBinding::Bind
          (BindResult *__return_storage_ptr__,DummyBinding *this,LambdaRefExpression *lambdaref,
          idx_t depth)

{
  bool bVar1;
  reference args_1;
  InternalException *this_00;
  pointer *__ptr;
  Expression *local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  string local_88;
  ColumnBinding binding;
  column_t column_index;
  idx_t depth_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  depth_local = depth;
  (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
            (&local_88,lambdaref);
  bVar1 = Binding::TryGetBindingIndex(&this->super_Binding,&local_88,&column_index);
  ::std::__cxx11::string::~string((string *)&local_88);
  if (bVar1) {
    binding.table_index = (this->super_Binding).index;
    binding.column_index = column_index;
    (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_88,lambdaref);
    args_1 = vector<duckdb::LogicalType,_true>::get<true>(&(this->super_Binding).types,column_index)
    ;
    make_uniq<duckdb::BoundLambdaRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&,unsigned_long&>
              ((duckdb *)&local_98,&local_88,args_1,&binding,&lambdaref->lambda_idx,&depth_local);
    local_90._M_head_impl = local_98;
    local_98 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_90);
    if (local_90._M_head_impl != (Expression *)0x0) {
      (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_90._M_head_impl = (Expression *)0x0;
    if (local_98 != (Expression *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    local_98 = (Expression *)0x0;
    ::std::__cxx11::string::~string((string *)&local_88);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,"Column %s not found in bindings",(allocator *)&binding);
  (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
            (&local_48,lambdaref);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_88,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult DummyBinding::Bind(LambdaRefExpression &lambdaref, idx_t depth) {
	column_t column_index;
	if (!TryGetBindingIndex(lambdaref.GetName(), column_index)) {
		throw InternalException("Column %s not found in bindings", lambdaref.GetName());
	}
	ColumnBinding binding(index, column_index);
	return BindResult(make_uniq<BoundLambdaRefExpression>(lambdaref.GetName(), types[column_index], binding,
	                                                      lambdaref.lambda_idx, depth));
}